

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# precomputed_scalar_reference_finite_element.h
# Opt level: O0

Matrix<double,__1,__1,_0,__1,__1> * __thiscall
lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::EvalReferenceShapeFunctions
          (Matrix<double,__1,__1,_0,__1,__1> *__return_storage_ptr__,
          PrecomputedScalarReferenceFiniteElement<double> *this,MatrixXd *local)

{
  allocator<char> local_299;
  string local_298;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  string local_228;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  MatrixXd *local_20;
  MatrixXd *local_local;
  PrecomputedScalarReferenceFiniteElement<double> *this_local;
  
  local_20 = local;
  local_local = (MatrixXd *)this;
  this_local = (PrecomputedScalarReferenceFiniteElement<double> *)__return_storage_ptr__;
  if (this->fe_ == (ScalarReferenceFiniteElement<double> *)0x0) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::operator<<(local_198,"Not initialized.");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"fe_ != nullptr",&local_1d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/precomputed_scalar_reference_finite_element.h"
               ,&local_201);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1d8,&local_200,0x73,&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator(&local_201);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::allocator<char>::~allocator(&local_1d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"false",&local_249);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/precomputed_scalar_reference_finite_element.h"
               ,&local_271);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"",&local_299);
    lf::base::AssertionFailed(&local_248,&local_270,0x73,&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    std::allocator<char>::~allocator(&local_299);
    std::__cxx11::string::~string((string *)&local_270);
    std::allocator<char>::~allocator(&local_271);
    std::__cxx11::string::~string((string *)&local_248);
    std::allocator<char>::~allocator(&local_249);
    abort();
  }
  (*this->fe_->_vptr_ScalarReferenceFiniteElement[7])(__return_storage_ptr__,this->fe_,local);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] Eigen::Matrix<SCALAR, Eigen::Dynamic, Eigen::Dynamic>
  EvalReferenceShapeFunctions(const Eigen::MatrixXd& local) const override {
    LF_ASSERT_MSG(fe_ != nullptr, "Not initialized.");
    return fe_->EvalReferenceShapeFunctions(local);
  }